

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O2

bool __thiscall
TxIndex::FindTx(TxIndex *this,uint256 *tx_hash,uint256 *block_hash,CTransactionRef *tx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  Level in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char (*in_stack_fffffffffffffe98) [7];
  AutoFile file;
  CDiskTxPos postx;
  CBlockHeader header;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  postx.super_FlatFilePos.nFile = -1;
  postx.super_FlatFilePos.nPos = 0;
  postx.nTxOffset = 0;
  bVar2 = DB::ReadTxPos((this->m_db)._M_t.
                        super___uniq_ptr_impl<TxIndex::DB,_std::default_delete<TxIndex::DB>_>._M_t.
                        super__Tuple_impl<0UL,_TxIndex::DB_*,_std::default_delete<TxIndex::DB>_>.
                        super__Head_base<0UL,_TxIndex::DB_*,_false>._M_head_impl,tx_hash,&postx);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_006e8325;
  }
  ::node::BlockManager::OpenBlockFile
            (&file,((this->super_BaseIndex).m_chainstate)->m_blockman,&postx.super_FlatFilePos,true)
  ;
  if (file.m_file == (FILE *)0x0) {
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/txindex.cpp"
    ;
    source_file_00._M_len = 0x5a;
    logging_function_00._M_str = "FindTx";
    logging_function_00._M_len = 6;
    LogPrintf_<char[7]>(logging_function_00,source_file_00,0x54,
                        IPC|I2P|QT|LIBEVENT|PRUNE|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|ZMQ
                        ,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffe98);
LAB_006e8319:
    bVar2 = false;
  }
  else {
    CBlockHeader::CBlockHeader(&header);
    CBlockHeader::SerializationOps<AutoFile,CBlockHeader,ActionUnserialize>(&header,&file);
    iVar3 = fseek((FILE *)file.m_file,(ulong)postx.nTxOffset,1);
    if (iVar3 != 0) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/txindex.cpp"
      ;
      source_file._M_len = 0x5a;
      logging_function._M_str = "FindTx";
      logging_function._M_len = 6;
      LogPrintf_<char[7]>(logging_function,source_file,0x5b,
                          IPC|I2P|QT|LIBEVENT|PRUNE|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|
                          ZMQ|BENCH|HTTP|TOR,in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                          in_stack_fffffffffffffe98);
      goto LAB_006e8319;
    }
    log_msg._M_dataplus._M_p = "\x017TxIndex";
    log_msg._M_string_length = (size_type)tx;
    ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<AutoFile>
              ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)&log_msg
               ,&file);
    bVar2 = transaction_identifier<false>::operator!=
                      (&((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->hash,tx_hash);
    if (bVar2) {
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/txindex.cpp"
      ;
      source_file_01._M_len = 0x5a;
      logging_function_01._M_str = "FindTx";
      logging_function_01._M_len = 6;
      LogPrintf_<char[7]>(logging_function_01,source_file_01,100,
                          IPC|I2P|QT|LIBEVENT|PRUNE|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|
                          WALLETDB|ZMQ|BENCH|MEMPOOL,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
      goto LAB_006e8319;
    }
    CBlockHeader::GetHash((uint256 *)&log_msg,&header);
    *(size_type *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x10) =
         log_msg.field_2._M_allocated_capacity;
    *(undefined8 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x18) =
         log_msg.field_2._8_8_;
    *(pointer *)(block_hash->super_base_blob<256U>).m_data._M_elems = log_msg._M_dataplus._M_p;
    *(size_type *)((block_hash->super_base_blob<256U>).m_data._M_elems + 8) =
         log_msg._M_string_length;
    bVar2 = true;
  }
  AutoFile::~AutoFile(&file);
LAB_006e8325:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool TxIndex::FindTx(const uint256& tx_hash, uint256& block_hash, CTransactionRef& tx) const
{
    CDiskTxPos postx;
    if (!m_db->ReadTxPos(tx_hash, postx)) {
        return false;
    }

    AutoFile file{m_chainstate->m_blockman.OpenBlockFile(postx, true)};
    if (file.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }
    CBlockHeader header;
    try {
        file >> header;
        if (fseek(file.Get(), postx.nTxOffset, SEEK_CUR)) {
            LogError("%s: fseek(...) failed\n", __func__);
            return false;
        }
        file >> TX_WITH_WITNESS(tx);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s\n", __func__, e.what());
        return false;
    }
    if (tx->GetHash() != tx_hash) {
        LogError("%s: txid mismatch\n", __func__);
        return false;
    }
    block_hash = header.GetHash();
    return true;
}